

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

TCGv_i64 cpu_reg_aarch64(DisasContext_conflict1 *s,int reg)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i64 pTVar1;
  uintptr_t o;
  TCGContext_conflict1 *tcg_ctx;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (reg == 0x1f) {
    pTVar1 = new_tmp_a64_aarch64(s);
    tcg_gen_op2_aarch64(tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(pTVar1 + (long)tcg_ctx_00),0);
  }
  else {
    pTVar1 = tcg_ctx_00->cpu_X[reg];
  }
  return pTVar1;
}

Assistant:

TCGv_i64 cpu_reg(DisasContext *s, int reg)
{
    if (reg == 31) {
        return new_tmp_a64_zero(s);
    } else {
        return s->uc->tcg_ctx->cpu_X[reg];
    }
}